

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86::forward_inplace(BatchNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  void *pvVar18;
  int iVar19;
  _func_int **pp_Var20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  float *pfVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  bool bVar31;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  Mat local_78;
  
  iVar19 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar19 == 2) {
      uVar26 = 0;
      iVar24 = bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        iVar24 = 0;
      }
      pp_Var20 = this->_vptr_BatchNorm_x86;
      uVar25 = (ulong)(uint)bottom_top_blob->h;
      if (bottom_top_blob->h < 1) {
        uVar25 = uVar26;
      }
      for (; uVar26 != uVar25; uVar26 = uVar26 + 1) {
        pfVar27 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var20[-3]) + uVar26 * 0x10);
        fVar5 = *pfVar27;
        fVar6 = pfVar27[1];
        fVar7 = pfVar27[2];
        fVar8 = pfVar27[3];
        pfVar27 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var20[-3]) + uVar26 * 0x10);
        fVar9 = *pfVar27;
        fVar10 = pfVar27[1];
        fVar11 = pfVar27[2];
        fVar12 = pfVar27[3];
        pfVar27 = (float *)((long)bottom_top_blob->w * uVar26 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        iVar28 = iVar24;
        while (bVar31 = iVar28 != 0, iVar28 = iVar28 + -1, bVar31) {
          *pfVar27 = *pfVar27 * fVar9 + fVar5;
          pfVar27[1] = pfVar27[1] * fVar10 + fVar6;
          pfVar27[2] = pfVar27[2] * fVar11 + fVar7;
          pfVar27[3] = pfVar27[3] * fVar12 + fVar8;
          pfVar27 = pfVar27 + 4;
        }
      }
    }
    else if (iVar19 == 1) {
      pp_Var20 = this->_vptr_BatchNorm_x86;
      uVar25 = 0;
      uVar26 = (ulong)(uint)bottom_top_blob->w;
      if (bottom_top_blob->w < 1) {
        uVar26 = uVar25;
      }
      for (; uVar26 * 0x10 != uVar25; uVar25 = uVar25 + 0x10) {
        pfVar27 = (float *)((long)bottom_top_blob->data + uVar25);
        fVar5 = pfVar27[1];
        fVar6 = pfVar27[2];
        fVar7 = pfVar27[3];
        pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)pp_Var20[-3]) + uVar25);
        fVar8 = pfVar1[1];
        fVar9 = pfVar1[2];
        fVar10 = pfVar1[3];
        pfVar2 = (float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var20[-3]) + uVar25);
        fVar11 = pfVar2[1];
        fVar12 = pfVar2[2];
        fVar13 = pfVar2[3];
        pfVar3 = (float *)((long)bottom_top_blob->data + uVar25);
        *pfVar3 = *pfVar27 * *pfVar1 + *pfVar2;
        pfVar3[1] = fVar5 * fVar8 + fVar11;
        pfVar3[2] = fVar6 * fVar9 + fVar12;
        pfVar3[3] = fVar7 * fVar10 + fVar13;
      }
    }
    if (iVar19 - 3U < 2) {
      uVar29 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      uVar25 = 0;
      uVar26 = (ulong)uVar29;
      if ((int)uVar29 < 1) {
        uVar26 = uVar25;
      }
      uVar21 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar21 = uVar25;
      }
      for (; uVar25 != uVar21; uVar25 = uVar25 + 1) {
        puVar4 = (undefined8 *)
                 (*(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86[-3]) +
                 uVar25 * 0x10);
        uVar14 = *puVar4;
        uVar15 = puVar4[1];
        puVar4 = (undefined8 *)
                 (*(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86[-3]) +
                 uVar25 * 0x10);
        uVar16 = *puVar4;
        uVar17 = puVar4[1];
        Mat::channel(&local_78,bottom_top_blob,(int)uVar25);
        pfVar27 = (float *)local_78.data;
        Mat::~Mat(&local_78);
        local_98 = (float)uVar16;
        fStack_94 = (float)((ulong)uVar16 >> 0x20);
        fStack_90 = (float)uVar17;
        fStack_8c = (float)((ulong)uVar17 >> 0x20);
        local_88 = (float)uVar14;
        fStack_84 = (float)((ulong)uVar14 >> 0x20);
        fStack_80 = (float)uVar15;
        fStack_7c = (float)((ulong)uVar15 >> 0x20);
        uVar22 = uVar26;
        while (iVar19 = (int)uVar22, uVar22 = (ulong)(iVar19 - 1), iVar19 != 0) {
          *pfVar27 = *pfVar27 * local_98 + local_88;
          pfVar27[1] = pfVar27[1] * fStack_94 + fStack_84;
          pfVar27[2] = pfVar27[2] * fStack_90 + fStack_80;
          pfVar27[3] = pfVar27[3] * fStack_8c + fStack_7c;
          pfVar27 = pfVar27 + 4;
        }
      }
    }
  }
  else {
    if (iVar19 - 5U < 0xfffffffe) {
      iVar19 = BatchNorm::forward_inplace
                         ((BatchNorm *)
                          ((long)&this->_vptr_BatchNorm_x86 + (long)this->_vptr_BatchNorm_x86[-3]),
                          bottom_top_blob,opt);
      return iVar19;
    }
    iVar19 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    pp_Var20 = this->_vptr_BatchNorm_x86;
    for (lVar30 = 0; lVar30 < *(int *)(&this->field_0xd0 + (long)pp_Var20[-3]); lVar30 = lVar30 + 1)
    {
      Mat::channel(&local_78,bottom_top_blob,(int)lVar30);
      pvVar18 = local_78.data;
      Mat::~Mat(&local_78);
      pp_Var20 = this->_vptr_BatchNorm_x86;
      fVar5 = *(float *)(*(long *)(&this->field_0x1f8 + (long)pp_Var20[-3]) + lVar30 * 4);
      fVar6 = *(float *)(*(long *)(&this->field_0x240 + (long)pp_Var20[-3]) + lVar30 * 4);
      lVar23 = 0;
      pfVar27 = (float *)pvVar18;
      for (iVar24 = 0; iVar24 + 3 < iVar19; iVar24 = iVar24 + 4) {
        *pfVar27 = *pfVar27 * fVar6 + fVar5;
        pfVar27[1] = pfVar27[1] * fVar6 + fVar5;
        pfVar27[2] = pfVar27[2] * fVar6 + fVar5;
        pfVar27[3] = pfVar27[3] * fVar6 + fVar5;
        pfVar27 = pfVar27 + 4;
        lVar23 = lVar23 + 4;
      }
      for (; (int)lVar23 < iVar19; lVar23 = lVar23 + 1) {
        *(float *)((long)pvVar18 + lVar23 * 4) =
             *(float *)((long)pvVar18 + lVar23 * 4) * fVar6 + fVar5;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}